

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteStream.c
# Opt level: O0

void sysbvm_byteStream_nextPutStringWithSize
               (sysbvm_context_t *context,sysbvm_tuple_t byteStream,size_t stringSize,char *string)

{
  _Bool _Var1;
  sysbvm_size_t sVar2;
  size_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_object_tuple_t *storage;
  size_t requiredCapacity;
  size_t capacity;
  size_t size;
  sysbvm_byteStream_t *byteStreamObject;
  char *string_local;
  size_t stringSize_local;
  sysbvm_tuple_t byteStream_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(byteStream);
  if ((_Var1) && (stringSize != 0)) {
    sVar2 = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(byteStream + 0x10));
    sVar3 = sysbvm_tuple_getSizeInBytes(*(sysbvm_tuple_t *)(byteStream + 0x18));
    if (sVar3 < sVar2 + stringSize) {
      sysbvm_byteStream_increaseCapacityToAtLeast(context,byteStream,sVar2 + stringSize);
    }
    memcpy((void *)(*(long *)(byteStream + 0x18) + 0x10 + sVar2),string,stringSize);
    sVar4 = sysbvm_tuple_size_encode(context,sVar2 + stringSize);
    *(sysbvm_tuple_t *)(byteStream + 0x10) = sVar4;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_byteStream_nextPutStringWithSize(sysbvm_context_t *context, sysbvm_tuple_t byteStream, size_t stringSize, const char *string)
{
    if(!sysbvm_tuple_isNonNullPointer(byteStream) || stringSize == 0)
        return;

    sysbvm_byteStream_t *byteStreamObject = (sysbvm_byteStream_t*)byteStream;
    size_t size = sysbvm_tuple_size_decode(byteStreamObject->size);
    size_t capacity = sysbvm_tuple_getSizeInBytes(byteStreamObject->storage);
    size_t requiredCapacity = size + stringSize;
    if(requiredCapacity > capacity)
        sysbvm_byteStream_increaseCapacityToAtLeast(context, byteStream, requiredCapacity);

    sysbvm_object_tuple_t *storage = (sysbvm_object_tuple_t*)byteStreamObject->storage;
    memcpy(storage->bytes + size, string, stringSize);
    byteStreamObject->size = sysbvm_tuple_size_encode(context, size + stringSize);
}